

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_false>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::
insert_node_<true,true,false,Gudhi::Vector_filtration_value_const&>
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this,
          Siblings *sib,Vertex_handle v,Vector_filtration_value *filtration_value)

{
  __node_base_ptr p_Var1;
  undefined6 in_register_00000012;
  ulong uVar2;
  ulong extraout_RDX;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_false>,_bool>
  *ret_val;
  Vector_filtration_value *in_R8;
  pair<boost::container::vec_iterator<boost::container::dtl::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_false>,_bool>
  pVar3;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_false>,_bool>
  pVar4;
  ushort local_4a;
  undefined1 local_48 [16];
  __buckets_ptr local_38;
  char local_30;
  
  local_48._0_8_ = CONCAT62(in_register_00000012,v);
  local_4a = (ushort)filtration_value;
  local_48._8_8_ = (pointer)0x0;
  pVar3 = boost::container::dtl::
          flat_tree<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>,boost::container::dtl::select1st<short>,std::less<short>,boost::container::new_allocator<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>>>
          ::
          try_emplace<short_const&,Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,boost::container::flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>,std::less<short>,void>>*&,Gudhi::Vector_filtration_value_const&>
                    ((flat_tree<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>,boost::container::dtl::select1st<short>,std::less<short>,boost::container::new_allocator<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>>>
                      *)&local_38,(const_iterator *)(local_48._0_8_ + 0x10),(short *)(local_48 + 8),
                     (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>_>
                      **)&local_4a,(Vector_filtration_value *)local_48);
  uVar2 = pVar3._8_8_;
  (this->nodes_label_to_list_)._M_h._M_buckets = local_38;
  *(char *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_30;
  if (*(short *)&local_38[5][1]._M_nxt != *(short *)local_38) {
    p_Var1 = (__node_base_ptr)operator_new(0x28);
    uVar2 = (ulong)local_4a;
    p_Var1->_M_nxt = (_Hash_node_base *)local_48._0_8_;
    *(ushort *)&p_Var1[1]._M_nxt = local_4a;
    p_Var1[2]._M_nxt = (_Hash_node_base *)0x0;
    p_Var1[3]._M_nxt = (_Hash_node_base *)0x0;
    p_Var1[4]._M_nxt = (_Hash_node_base *)0x0;
    local_38[5] = p_Var1;
  }
  if (local_30 == '\0') {
    unify_lifetimes((Vector_filtration_value *)(local_38 + 1),in_R8);
    uVar2 = extraout_RDX;
  }
  pVar4._8_8_ = uVar2;
  pVar4.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
        *)this;
  return pVar4;
}

Assistant:

std::pair<Dictionary_it, bool> insert_node_(Siblings *sib, Vertex_handle v, Filt&& filtration_value) {
    std::pair<Dictionary_it, bool> ins = sib->members_.try_emplace(v, sib, std::forward<Filt>(filtration_value));

    if constexpr (update_children){
      if (!(has_children(ins.first))) {
        ins.first->second.assign_children(new Siblings(sib, v));
      }
    }

    if (ins.second){
      // Only required when insertion is successful
      update_simplex_tree_after_node_insertion(ins.first);
      return ins;
    }

    if constexpr (Options::store_filtration && update_fil){
      if (unify_lifetimes(ins.first->second.filtration(), filtration_value)) return ins;
    }

    if constexpr (set_to_null){
      ins.first = Dictionary_it();
    }

    return ins;
  }